

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_dform39(DisasContext_conflict10 *ctx)

{
  _Bool _Var1;
  uint uVar2;
  TCGContext_conflict10 *pTVar3;
  uint uVar4;
  TCGTemp *pTVar5;
  TCGTemp *ts;
  uintptr_t o_1;
  TCGv_i64 pTVar6;
  uint32_t excp;
  TCGOpcode opc;
  TCGContext_conflict10 *s;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i64 ret;
  TCGv_i64 pTVar7;
  
  switch(ctx->opcode & 3) {
  case 0:
    if ((ctx->insns_flags2 & 0x20) == 0) goto switchD_00b821ee_caseD_1;
    if (ctx->fpu_enabled == false) {
      excp = 7;
      goto LAB_00b825b8;
    }
    s = ctx->uc->tcg_ctx;
    if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
      tcg_gen_op2_ppc64(s,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)s),0x30);
      ctx->access_type = 0x30;
    }
    pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)pTVar5 - (long)s);
    pTVar3 = ctx->uc->tcg_ctx;
    uVar2 = ctx->opcode;
    pTVar7 = (TCGv_i64)(long)(short)uVar2;
    uVar4 = uVar2 >> 0x10 & 0x1f;
    if (uVar4 == 0) {
      pTVar6 = (TCGv_i64)((ulong)pTVar7 & 0xffffffff);
      if (ctx->sf_mode != false) {
        pTVar6 = pTVar7;
      }
      opc = INDEX_op_movi_i64;
LAB_00b8248e:
      tcg_gen_op2_ppc64(pTVar3,opc,(TCGArg)((long)pTVar3 + (long)ret),(TCGArg)pTVar6);
    }
    else if ((uVar2 & 0xffff) == 0) {
      pTVar6 = cpu_gpr[uVar4];
      if (ctx->sf_mode == false) goto LAB_00b822a5;
      if (pTVar6 != ret) {
        pTVar6 = pTVar6 + (long)pTVar3;
        opc = INDEX_op_mov_i64;
        goto LAB_00b8248e;
      }
    }
    else {
      tcg_gen_addi_i64_ppc64(pTVar3,ret,cpu_gpr[uVar4],(int64_t)pTVar7);
      pTVar6 = ret;
      if (ctx->sf_mode == false) {
LAB_00b822a5:
        tcg_gen_ext32u_i64_ppc64(pTVar3,ret,pTVar6);
      }
    }
    pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    _Var1 = ctx->le_mode;
    tcg_gen_qemu_ld_i64_ppc64
              (ctx->uc->tcg_ctx,(TCGv_i64)((long)pTVar5 - (long)s),ret,(long)ctx->mem_idx,
               ctx->default_tcg_memop_mask | MO_64);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((uint)_Var1 * 0x10 + 0x12b28 + (ctx->opcode >> 0x11 & 0x1f0)));
    tcg_gen_addi_i64_ppc64(s,ret,ret,8);
    tcg_gen_qemu_ld_i64_ppc64
              (ctx->uc->tcg_ctx,(TCGv_i64)((long)pTVar5 - (long)s),ret,(long)ctx->mem_idx,
               ctx->default_tcg_memop_mask | MO_64);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0x11 & 0x1f0) + 0x12b28 + (uint)(_Var1 ^ 1) * 0x10));
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
    goto LAB_00b82593;
  case 1:
switchD_00b821ee_caseD_1:
    gen_exception_err(ctx,0x60,0x21);
    return;
  case 2:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto switchD_00b821ee_caseD_1;
    if (ctx->altivec_enabled == false) {
LAB_00b825a6:
      excp = 0x49;
LAB_00b825b8:
      gen_exception(ctx,excp);
      return;
    }
    s = ctx->uc->tcg_ctx;
    pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar7 = (TCGv_i64)((long)pTVar5 - (long)s);
    if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
      pTVar3 = ctx->uc->tcg_ctx;
      tcg_gen_op2_ppc64(pTVar3,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar3),0x20);
      ctx->access_type = 0x20;
    }
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    gen_addr_imm_index(ctx,(TCGv_i64)((long)ts - (long)s),3);
    tcg_gen_qemu_ld_i64_ppc64
              (ctx->uc->tcg_ctx,pTVar7,(TCGv_i64)((long)ts - (long)s),(long)ctx->mem_idx,
               ctx->default_tcg_memop_mask | MO_64);
    break;
  case 3:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto switchD_00b821ee_caseD_1;
    if (ctx->altivec_enabled == false) goto LAB_00b825a6;
    s = ctx->uc->tcg_ctx;
    pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar7 = (TCGv_i64)((long)pTVar5 - (long)s);
    if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
      pTVar3 = ctx->uc->tcg_ctx;
      tcg_gen_op2_ppc64(pTVar3,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar3),0x20);
      ctx->access_type = 0x20;
    }
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    gen_addr_imm_index(ctx,(TCGv_i64)((long)ts - (long)s),3);
    gen_qemu_ld32fs(ctx,pTVar7,(TCGv_i64)((long)ts - (long)s));
  }
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12d28);
  tcg_temp_free_internal_ppc64(s,ts);
  pTVar5 = (TCGTemp *)(pTVar7 + (long)s);
LAB_00b82593:
  tcg_temp_free_internal_ppc64(s,pTVar5);
  return;
}

Assistant:

static void gen_dform39(DisasContext *ctx)
{
    switch (ctx->opcode & 0x3) {
    case 0: /* lfdp */
        if (ctx->insns_flags2 & PPC2_ISA205) {
            return gen_lfdp(ctx);
        }
        break;
    case 2: /* lxsd */
        if (ctx->insns_flags2 & PPC2_ISA300) {
            return gen_lxsd(ctx);
        }
        break;
    case 3: /* lxssp */
        if (ctx->insns_flags2 & PPC2_ISA300) {
            return gen_lxssp(ctx);
        }
        break;
    }
    return gen_invalid(ctx);
}